

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

QAbstractItemModel * createListModel(QObject *parent)

{
  QStringListModel *this;
  QList<QString> *pQVar1;
  QArrayDataPointer<char16_t> local_1a0;
  QString local_188;
  QArrayDataPointer<char16_t> local_170;
  QString local_158;
  QArrayDataPointer<char16_t> local_140;
  QString local_128;
  QArrayDataPointer<char16_t> local_110;
  QString local_f8;
  QArrayDataPointer<char16_t> local_d0;
  QString local_b8;
  QList<QString> local_a0;
  QObject *local_88;
  QObject *parent_local;
  char16_t *str_4;
  QArrayDataPointer<char16_t> *local_70;
  char16_t *local_68;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_88 = parent;
  this = (QStringListModel *)operator_new(0x28);
  memset(&local_a0,0,0x18);
  QList<QString>::QList(&local_a0);
  local_10 = &local_d0;
  str = L"1";
  local_20 = L"1";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_d0,(Data *)0x0,L"1",1);
  QString::QString(&local_b8,&local_d0);
  pQVar1 = QList<QString>::operator<<(&local_a0,&local_b8);
  local_28 = &local_110;
  str_1 = L"2";
  local_38 = L"2";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_110,(Data *)0x0,L"2",1);
  QString::QString(&local_f8,&local_110);
  pQVar1 = QList<QString>::operator<<(pQVar1,&local_f8);
  local_40 = &local_140;
  str_2 = L"3";
  local_50 = L"3";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_140,(Data *)0x0,L"3",1);
  QString::QString(&local_128,&local_140);
  pQVar1 = QList<QString>::operator<<(pQVar1,&local_128);
  local_58 = &local_170;
  str_3 = L"4";
  local_68 = L"4";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_170,(Data *)0x0,L"4",1);
  QString::QString(&local_158,&local_170);
  pQVar1 = QList<QString>::operator<<(pQVar1,&local_158);
  local_70 = &local_1a0;
  str_4 = L"5";
  parent_local = (QObject *)anon_var_dwarf_13d7b;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1a0,(Data *)0x0,L"5",1);
  QString::QString(&local_188,&local_1a0);
  pQVar1 = QList<QString>::operator<<(pQVar1,&local_188);
  QStringListModel::QStringListModel(this,(QList_conflict1 *)pQVar1,local_88);
  QString::~QString(&local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a0);
  QString::~QString(&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
  QString::~QString(&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_140);
  QString::~QString(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
  QString::~QString(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  QList<QString>::~QList(&local_a0);
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createListModel(QObject *parent)
{
    return new QStringListModel(
            QStringList() << QStringLiteral("1") << QStringLiteral("2") << QStringLiteral("3") << QStringLiteral("4") << QStringLiteral("5"), parent);
}